

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::BuildDebugInlinedAtChain
          (DebugInfoManager *this,uint32_t callee_inlined_at,DebugInlinedAtContext *inlined_at_ctx)

{
  uint32_t uVar1;
  DebugScope *pDVar2;
  Instruction *pIVar3;
  Instruction *new_inlined_at_in_chain;
  Instruction *last_inlined_at_in_chain;
  uint32_t chain_iter_id;
  uint32_t chain_head_id;
  uint32_t new_dbg_inlined_at_id;
  uint32_t already_generated_chain_head_id;
  DebugInlinedAtContext *inlined_at_ctx_local;
  uint32_t callee_inlined_at_local;
  DebugInfoManager *this_local;
  
  pDVar2 = DebugInlinedAtContext::GetScopeOfCallInstruction(inlined_at_ctx);
  uVar1 = DebugScope::GetLexicalScope(pDVar2);
  if (uVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         DebugInlinedAtContext::GetDebugInlinedAtChain(inlined_at_ctx,callee_inlined_at);
    if (this_local._4_4_ == 0) {
      pIVar3 = DebugInlinedAtContext::GetLineOfCallInstruction(inlined_at_ctx);
      pDVar2 = DebugInlinedAtContext::GetScopeOfCallInstruction(inlined_at_ctx);
      this_local._4_4_ = CreateDebugInlinedAt(this,pIVar3,pDVar2);
      if (this_local._4_4_ == 0) {
        this_local._4_4_ = 0;
      }
      else if (callee_inlined_at == 0) {
        DebugInlinedAtContext::SetDebugInlinedAtChain(inlined_at_ctx,0,this_local._4_4_);
      }
      else {
        last_inlined_at_in_chain._4_4_ = 0;
        new_inlined_at_in_chain = (Instruction *)0x0;
        last_inlined_at_in_chain._0_4_ = callee_inlined_at;
        do {
          pIVar3 = CloneDebugInlinedAt(this,(uint32_t)last_inlined_at_in_chain,
                                       new_inlined_at_in_chain);
          if (pIVar3 == (Instruction *)0x0) {
            __assert_fail("new_inlined_at_in_chain != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                          ,0x130,
                          "uint32_t spvtools::opt::analysis::DebugInfoManager::BuildDebugInlinedAtChain(uint32_t, DebugInlinedAtContext *)"
                         );
          }
          if (last_inlined_at_in_chain._4_4_ == 0) {
            last_inlined_at_in_chain._4_4_ = opt::Instruction::result_id(pIVar3);
          }
          if (new_inlined_at_in_chain != (Instruction *)0x0) {
            uVar1 = opt::Instruction::result_id(pIVar3);
            anon_unknown_0::SetInlinedOperand(new_inlined_at_in_chain,uVar1);
          }
          last_inlined_at_in_chain._0_4_ = anon_unknown_0::GetInlinedOperand(pIVar3);
          new_inlined_at_in_chain = pIVar3;
        } while ((uint32_t)last_inlined_at_in_chain != 0);
        anon_unknown_0::SetInlinedOperand(pIVar3,this_local._4_4_);
        DebugInlinedAtContext::SetDebugInlinedAtChain
                  (inlined_at_ctx,callee_inlined_at,last_inlined_at_in_chain._4_4_);
        this_local._4_4_ = last_inlined_at_in_chain._4_4_;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t DebugInfoManager::BuildDebugInlinedAtChain(
    uint32_t callee_inlined_at, DebugInlinedAtContext* inlined_at_ctx) {
  if (inlined_at_ctx->GetScopeOfCallInstruction().GetLexicalScope() ==
      kNoDebugScope)
    return kNoInlinedAt;

  // Reuse the already generated DebugInlinedAt chain if exists.
  uint32_t already_generated_chain_head_id =
      inlined_at_ctx->GetDebugInlinedAtChain(callee_inlined_at);
  if (already_generated_chain_head_id != kNoInlinedAt) {
    return already_generated_chain_head_id;
  }

  const uint32_t new_dbg_inlined_at_id =
      CreateDebugInlinedAt(inlined_at_ctx->GetLineOfCallInstruction(),
                           inlined_at_ctx->GetScopeOfCallInstruction());
  if (new_dbg_inlined_at_id == kNoInlinedAt) return kNoInlinedAt;

  if (callee_inlined_at == kNoInlinedAt) {
    inlined_at_ctx->SetDebugInlinedAtChain(kNoInlinedAt, new_dbg_inlined_at_id);
    return new_dbg_inlined_at_id;
  }

  uint32_t chain_head_id = kNoInlinedAt;
  uint32_t chain_iter_id = callee_inlined_at;
  Instruction* last_inlined_at_in_chain = nullptr;
  do {
    Instruction* new_inlined_at_in_chain = CloneDebugInlinedAt(
        chain_iter_id, /* insert_before */ last_inlined_at_in_chain);
    assert(new_inlined_at_in_chain != nullptr);

    // Set DebugInlinedAt of the new scope as the head of the chain.
    if (chain_head_id == kNoInlinedAt)
      chain_head_id = new_inlined_at_in_chain->result_id();

    // Previous DebugInlinedAt of the chain must point to the new
    // DebugInlinedAt as its Inlined operand to build a recursive
    // chain.
    if (last_inlined_at_in_chain != nullptr) {
      SetInlinedOperand(last_inlined_at_in_chain,
                        new_inlined_at_in_chain->result_id());
    }
    last_inlined_at_in_chain = new_inlined_at_in_chain;

    chain_iter_id = GetInlinedOperand(new_inlined_at_in_chain);
  } while (chain_iter_id != kNoInlinedAt);

  // Put |new_dbg_inlined_at_id| into the end of the chain.
  SetInlinedOperand(last_inlined_at_in_chain, new_dbg_inlined_at_id);

  // Keep the new chain information that will be reused it.
  inlined_at_ctx->SetDebugInlinedAtChain(callee_inlined_at, chain_head_id);
  return chain_head_id;
}